

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O3

int mbedtls_entropy_self_test(int verbose)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *__s;
  uchar acc [64];
  uchar buf [64];
  mbedtls_entropy_context ctx;
  ulong local_4b8 [17];
  mbedtls_entropy_context local_430;
  
  local_4b8[0xe] = 0;
  local_4b8[0xf] = 0;
  local_4b8[0xc] = 0;
  local_4b8[0xd] = 0;
  local_4b8[10] = 0;
  local_4b8[0xb] = 0;
  local_4b8[8] = 0;
  local_4b8[9] = 0;
  local_4b8[6] = 0;
  local_4b8[7] = 0;
  local_4b8[4] = 0;
  local_4b8[5] = 0;
  local_4b8[2] = 0;
  local_4b8[3] = 0;
  local_4b8[0] = 0;
  local_4b8[1] = 0;
  if (verbose != 0) {
    printf("  ENTROPY test: ");
  }
  mbedtls_entropy_init(&local_430);
  iVar1 = entropy_gather_internal(&local_430);
  if (iVar1 == 0) {
    lVar2 = (long)local_430.source_count;
    if (lVar2 < 0x14) {
      local_430.source[lVar2].f_source = entropy_dummy_source;
      local_430.source[lVar2].p_source = (void *)0x0;
      local_430.source[lVar2].threshold = 0x10;
      local_430.source[lVar2].strong = 0;
      local_430.source_count = local_430.source_count + 1;
      iVar1 = entropy_update(&local_430,'\x14',(uchar *)(local_4b8 + 8),0x40);
      if (iVar1 == 0) {
        lVar2 = 0;
        do {
          iVar1 = mbedtls_entropy_func(&local_430,(uchar *)(local_4b8 + 8),0x40);
          if (iVar1 != 0) goto LAB_0011f18b;
          lVar3 = 0;
          do {
            *(ulong *)((long)local_4b8 + lVar3) =
                 *(ulong *)((long)local_4b8 + lVar3) | *(ulong *)((long)local_4b8 + lVar3 + 0x40);
            *(ulong *)((long)local_4b8 + lVar3 + 8) =
                 *(ulong *)((long)local_4b8 + lVar3 + 8) |
                 *(ulong *)((long)local_4b8 + lVar3 + 0x48);
            lVar3 = lVar3 + 0x10;
          } while (lVar3 != 0x40);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 8);
        lVar2 = 0;
        iVar1 = 0;
        do {
          if (*(char *)((long)local_4b8 + lVar2) == '\0') goto LAB_0011f18b;
          lVar2 = lVar2 + 1;
        } while (lVar2 != 0x40);
      }
    }
    else {
LAB_0011f18b:
      iVar1 = 1;
    }
  }
  mbedtls_sha512_free(&local_430.accumulator);
  local_430.source_count = 0;
  mbedtls_platform_zeroize(local_430.source,800);
  local_430.accumulator_started = 0;
  if (verbose != 0) {
    __s = "failed";
    if (iVar1 == 0) {
      __s = "passed";
    }
    puts(__s);
    putchar(10);
  }
  return (int)(iVar1 != 0);
}

Assistant:

int mbedtls_entropy_self_test( int verbose )
{
    int ret = 1;
#if !defined(MBEDTLS_TEST_NULL_ENTROPY)
    mbedtls_entropy_context ctx;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    unsigned char acc[MBEDTLS_ENTROPY_BLOCK_SIZE] = { 0 };
    size_t i, j;
#endif /* !MBEDTLS_TEST_NULL_ENTROPY */

    if( verbose != 0 )
        mbedtls_printf( "  ENTROPY test: " );

#if !defined(MBEDTLS_TEST_NULL_ENTROPY)
    mbedtls_entropy_init( &ctx );

    /* First do a gather to make sure we have default sources */
    if( ( ret = mbedtls_entropy_gather( &ctx ) ) != 0 )
        goto cleanup;

    ret = mbedtls_entropy_add_source( &ctx, entropy_dummy_source, NULL, 16,
                                      MBEDTLS_ENTROPY_SOURCE_WEAK );
    if( ret != 0 )
        goto cleanup;

    if( ( ret = mbedtls_entropy_update_manual( &ctx, buf, sizeof buf ) ) != 0 )
        goto cleanup;

    /*
     * To test that mbedtls_entropy_func writes correct number of bytes:
     * - use the whole buffer and rely on ASan to detect overruns
     * - collect entropy 8 times and OR the result in an accumulator:
     *   any byte should then be 0 with probably 2^(-64), so requiring
     *   each of the 32 or 64 bytes to be non-zero has a false failure rate
     *   of at most 2^(-58) which is acceptable.
     */
    for( i = 0; i < 8; i++ )
    {
        if( ( ret = mbedtls_entropy_func( &ctx, buf, sizeof( buf ) ) ) != 0 )
            goto cleanup;

        for( j = 0; j < sizeof( buf ); j++ )
            acc[j] |= buf[j];
    }

    for( j = 0; j < sizeof( buf ); j++ )
    {
        if( acc[j] == 0 )
        {
            ret = 1;
            goto cleanup;
        }
    }

#if defined(MBEDTLS_ENTROPY_HARDWARE_ALT)
    if( ( ret = mbedtls_entropy_source_self_test( 0 ) ) != 0 )
        goto cleanup;
#endif

cleanup:
    mbedtls_entropy_free( &ctx );
#endif /* !MBEDTLS_TEST_NULL_ENTROPY */

    if( verbose != 0 )
    {
        if( ret != 0 )
            mbedtls_printf( "failed\n" );
        else
            mbedtls_printf( "passed\n" );

        mbedtls_printf( "\n" );
    }

    return( ret != 0 );
}